

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_physfs.c
# Opt level: O0

int cmd_permitsyms(char *args)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  char *pcStack_10;
  int num;
  char *args_local;
  
  pcStack_10 = args;
  if (*args == '\"') {
    pcStack_10 = args + 1;
    sVar2 = strlen(pcStack_10);
    pcStack_10[sVar2 - 1] = '\0';
  }
  iVar1 = atoi(pcStack_10);
  PHYSFS_permitSymbolicLinks(iVar1);
  pcVar3 = "forbidden";
  if (iVar1 != 0) {
    pcVar3 = "permitted";
  }
  printf("Symlinks are now %s.\n",pcVar3);
  return 1;
}

Assistant:

static int cmd_permitsyms(char *args)
{
    int num;

    if (*args == '\"')
    {
        args++;
        args[strlen(args) - 1] = '\0';
    } /* if */

    num = atoi(args);
    PHYSFS_permitSymbolicLinks(num);
    printf("Symlinks are now %s.\n", num ? "permitted" : "forbidden");
    return 1;
}